

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::OnAssertExceptionCommand
          (CommandRunner *this,AssertExceptionCommand *command)

{
  pointer pcVar1;
  int iVar2;
  Result RVar3;
  char *format;
  bool bVar4;
  ActionResult result;
  long *local_90 [2];
  long local_80 [2];
  ActionResult local_70;
  
  RunAction(&local_70,this,(command->super_CommandMixin<(wabt::CommandType)11>).super_Command.line,
            &command->action,Quiet);
  if (local_70.trap.obj_ == (Trap *)0x0) {
    bVar4 = true;
  }
  else {
    local_90[0] = local_80;
    pcVar1 = ((local_70.trap.obj_)->message_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + ((local_70.trap.obj_)->message_)._M_string_length)
    ;
    iVar2 = std::__cxx11::string::compare((char *)local_90);
    bVar4 = iVar2 != 0;
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
  }
  format = "assert_exception passed";
  if (bVar4 != false) {
    format = "expected an exception to be thrown";
  }
  PrintError(this,(command->super_CommandMixin<(wabt::CommandType)11>).super_Command.line,format);
  if (local_70.trap.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_70.trap.store_,local_70.trap.root_index_);
    local_70.trap.obj_ = (Trap *)0x0;
    local_70.trap.store_ = (Store *)0x0;
    local_70.trap.root_index_ = 0;
  }
  if (local_70.values.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.values.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar4;
  return (Result)RVar3.enum_;
}

Assistant:

wabt::Result CommandRunner::OnAssertExceptionCommand(
    const AssertExceptionCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap || result.trap->message() != "uncaught exception") {
    PrintError(command->line, "expected an exception to be thrown");
    return wabt::Result::Error;
  }
  PrintError(command->line, "assert_exception passed");

  return wabt::Result::Ok;
}